

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_state(msocket_t *self)

{
  uint8_t state;
  msocket_t *self_local;
  
  if (self == (msocket_t *)0x0) {
    self_local._7_1_ = '\0';
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
    self_local._7_1_ = self->state;
    pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
  }
  return self_local._7_1_;
}

Assistant:

int8_t msocket_state(msocket_t *self){
   if(self != 0){
      uint8_t state;
      MUTEX_LOCK(self->mutex);
      state = self->state;
      MUTEX_UNLOCK(self->mutex);
      return state;
   }
   return 0;
}